

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParseVisibilityTest_Edition2024NonStrictExportMessage_Test::
~ParseVisibilityTest_Edition2024NonStrictExportMessage_Test
          (ParseVisibilityTest_Edition2024NonStrictExportMessage_Test *this)

{
  ZeroCopyInputStream *pZVar1;
  
  (this->super_ParseVisibilityTest).super_Test._vptr_Test = (_func_int **)&PTR__ParserTest_018d8b70;
  std::
  unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
  ::~unique_ptr(&(this->super_ParseVisibilityTest).parser_);
  std::
  unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
  ::~unique_ptr(&(this->super_ParseVisibilityTest).input_);
  pZVar1 = (this->super_ParseVisibilityTest).raw_input_._M_t.
           super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl;
  if (pZVar1 != (ZeroCopyInputStream *)0x0) {
    (*pZVar1->_vptr_ZeroCopyInputStream[1])();
  }
  (this->super_ParseVisibilityTest).raw_input_._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl =
       (ZeroCopyInputStream *)0x0;
  DescriptorPool::~DescriptorPool(&(this->super_ParseVisibilityTest).pool_);
  MockErrorCollector::~MockErrorCollector
            ((MockErrorCollector *)&(this->super_ParseVisibilityTest).error_collector_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseVisibilityTest, Edition2024NonStrictExportMessage) {
  ExpectParsesTo(
      R"schema(
        edition = "2024";
        export message A {
          local enum NestedEnum {
            A_VAL = 0;
          }
          export message NestedMessage {
          }
        })schema",
      R"pb(message_type {
             name: "A"
             enum_type {
               name: "NestedEnum"
               value { name: "A_VAL" number: 0 }
               visibility: VISIBILITY_LOCAL
             }
             nested_type { name: "NestedMessage" visibility: VISIBILITY_EXPORT }
             visibility: VISIBILITY_EXPORT
           }
           syntax: "editions"
           edition: EDITION_2024
      )pb");
}